

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsResub.c
# Opt level: O2

int Abc_NtkMfsTryResubOnce(Mfs_Man_t *p,int *pCands,int nCands)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  int *piVar5;
  int i;
  
  p->nSatCalls = p->nSatCalls + 1;
  iVar2 = sat_solver_solve(p->pSat,pCands,pCands + nCands,(long)p->pPars->nBTLimit,0,0,0);
  if (iVar2 == -1) {
    iVar2 = 1;
  }
  else {
    if (iVar2 == 1) {
      p->nSatCexes = p->nSatCexes + 1;
      piVar5 = &p->nCexes;
      iVar2 = 0;
      for (i = 0; i < p->vProjVarsSat->nSize; i = i + 1) {
        uVar3 = Vec_IntEntry(p->vProjVarsSat,i);
        pvVar4 = Vec_PtrEntry(p->vDivCexes,i);
        if (((int)uVar3 < 0) || (p->pSat->size <= (int)uVar3)) {
          __assert_fail("v >= 0 && v < s->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                        ,0xda,"int sat_solver_var_value(sat_solver *, int)");
        }
        if (p->pSat->model[uVar3] != 1) {
          uVar3 = *piVar5;
          uVar1 = *(uint *)((long)pvVar4 + (long)((int)uVar3 >> 5) * 4);
          if ((uVar1 >> (uVar3 & 0x1f) & 1) == 0) {
            __assert_fail("Abc_InfoHasBit(pData, p->nCexes)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/mfs/mfsResub.c"
                          ,0x91,"int Abc_NtkMfsTryResubOnce(Mfs_Man_t *, int *, int)");
          }
          *(uint *)((long)pvVar4 + (long)((int)uVar3 >> 5) * 4) = 1 << ((byte)uVar3 & 0x1f) ^ uVar1;
        }
      }
    }
    else {
      piVar5 = &p->nTimeOuts;
      iVar2 = -1;
    }
    *piVar5 = *piVar5 + 1;
  }
  return iVar2;
}

Assistant:

int Abc_NtkMfsTryResubOnce( Mfs_Man_t * p, int * pCands, int nCands )
{
    int fVeryVerbose = 0;
    unsigned * pData;
    int RetValue, RetValue2 = -1, iVar, i;//, clk = Abc_Clock();
/*
    if ( p->pPars->fGiaSat )
    {
        RetValue2 = Abc_NtkMfsTryResubOnceGia( p, pCands, nCands );
p->timeGia += Abc_Clock() - clk;
        return RetValue2;
    }
*/ 
    p->nSatCalls++;
    RetValue = sat_solver_solve( p->pSat, pCands, pCands + nCands, (ABC_INT64_T)p->pPars->nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
//    assert( RetValue == l_False || RetValue == l_True );

    if ( RetValue != l_Undef && RetValue2 != -1 )
    {
        assert( (RetValue == l_False) == (RetValue2 == 1) );
    }

    if ( RetValue == l_False )
    {
        if ( fVeryVerbose )
        printf( "U " );
        return 1;
    }
    if ( RetValue != l_True )
    {
        if ( fVeryVerbose )
        printf( "T " );
        p->nTimeOuts++;
        return -1;
    }
    if ( fVeryVerbose )
    printf( "S " );
    p->nSatCexes++;
    // store the counter-example
    Vec_IntForEachEntry( p->vProjVarsSat, iVar, i )
    {
        pData = (unsigned *)Vec_PtrEntry( p->vDivCexes, i );
        if ( !sat_solver_var_value( p->pSat, iVar ) ) // remove 0s!!!
        {
            assert( Abc_InfoHasBit(pData, p->nCexes) );
            Abc_InfoXorBit( pData, p->nCexes );
        }
    }
    p->nCexes++;
    return 0;

}